

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O2

void glmc_rotate_at(vec4 *m,float *pivot,float angle,float *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  __m128 m2;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  __m128 m0;
  float fVar24;
  float fVar25;
  __m128 m1;
  float fVar26;
  float fVar27;
  float fVar28;
  
  fVar1 = *pivot;
  fVar2 = pivot[1];
  fVar3 = pivot[2];
  fVar10 = m[2][1];
  fVar11 = m[2][2];
  fVar12 = m[2][3];
  fVar9 = m[3][1];
  fVar19 = m[3][2];
  fVar18 = m[3][3];
  fVar16 = m[1][1];
  fVar26 = m[1][2];
  fVar4 = m[1][3];
  fVar5 = (*m)[1];
  fVar6 = (*m)[2];
  fVar7 = (*m)[3];
  m[3][0] = (*m)[0] * fVar1 + m[1][0] * fVar2 + m[2][0] * fVar3 + m[3][0];
  m[3][1] = fVar5 * fVar1 + fVar16 * fVar2 + fVar10 * fVar3 + fVar9;
  m[3][2] = fVar6 * fVar1 + fVar26 * fVar2 + fVar11 * fVar3 + fVar19;
  m[3][3] = fVar7 * fVar1 + fVar4 * fVar2 + fVar12 * fVar3 + fVar18;
  fVar9 = cosf(angle);
  fVar10 = *axis;
  fVar11 = axis[1];
  fVar12 = axis[2];
  fVar26 = SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11);
  fVar16 = 1.0 / fVar26;
  fVar19 = 0.0;
  fVar18 = 0.0;
  if (1.1920929e-07 <= fVar26) {
    fVar19 = fVar10 * fVar16;
    fVar18 = fVar11 * fVar16;
  }
  fVar26 = (float)(~-(uint)(fVar26 < 1.1920929e-07) & (uint)(fVar12 * fVar16));
  fVar16 = 1.0 - fVar9;
  fVar10 = fVar16 * fVar19;
  fVar11 = fVar16 * fVar18;
  fVar16 = fVar16 * fVar26;
  fVar12 = sinf(angle);
  fVar17 = fVar19 * fVar11 - fVar12 * fVar26;
  fVar13 = fVar18 * fVar10 + fVar12 * fVar26;
  fVar27 = fVar19 * fVar16 + fVar18 * fVar12;
  fVar20 = fVar10 * fVar26 - fVar18 * fVar12;
  fVar28 = fVar18 * fVar16 - fVar19 * fVar12;
  fVar24 = fVar11 * fVar26 + fVar19 * fVar12;
  fVar15 = fVar19 * fVar10 + fVar9;
  fVar14 = fVar18 * fVar11 + fVar9;
  fVar9 = fVar16 * fVar26 + fVar9;
  fVar10 = (*m)[0];
  fVar11 = (*m)[1];
  fVar12 = (*m)[2];
  fVar19 = (*m)[3];
  fVar18 = m[1][0];
  fVar16 = m[1][1];
  fVar26 = m[1][2];
  fVar4 = m[1][3];
  fVar5 = m[2][0];
  fVar6 = m[2][1];
  fVar7 = m[2][2];
  fVar8 = m[2][3];
  fVar21 = fVar20 * fVar5 + fVar13 * fVar18 + fVar15 * fVar10;
  fVar22 = fVar20 * fVar6 + fVar13 * fVar16 + fVar15 * fVar11;
  fVar23 = fVar20 * fVar7 + fVar13 * fVar26 + fVar15 * fVar12;
  fVar13 = fVar20 * fVar8 + fVar13 * fVar4 + fVar15 * fVar19;
  fVar15 = fVar24 * fVar5 + fVar14 * fVar18 + fVar17 * fVar10;
  fVar20 = fVar24 * fVar6 + fVar14 * fVar16 + fVar17 * fVar11;
  fVar25 = fVar24 * fVar7 + fVar14 * fVar26 + fVar17 * fVar12;
  fVar14 = fVar24 * fVar8 + fVar14 * fVar4 + fVar17 * fVar19;
  fVar18 = fVar9 * fVar5 + fVar28 * fVar18 + fVar27 * fVar10;
  fVar16 = fVar9 * fVar6 + fVar28 * fVar16 + fVar27 * fVar11;
  fVar26 = fVar9 * fVar7 + fVar28 * fVar26 + fVar27 * fVar12;
  fVar19 = fVar9 * fVar8 + fVar28 * fVar4 + fVar27 * fVar19;
  fVar10 = m[3][0];
  fVar11 = m[3][1];
  fVar12 = m[3][2];
  fVar9 = m[3][3];
  (*m)[0] = fVar21;
  (*m)[1] = fVar22;
  (*m)[2] = fVar23;
  (*m)[3] = fVar13;
  m[1][0] = fVar15;
  m[1][1] = fVar20;
  m[1][2] = fVar25;
  m[1][3] = fVar14;
  m[2][0] = fVar18;
  m[2][1] = fVar16;
  m[2][2] = fVar26;
  m[2][3] = fVar19;
  m[3][0] = ((fVar10 - fVar3 * fVar18) - fVar2 * fVar15) - fVar1 * fVar21;
  m[3][1] = ((fVar11 - fVar3 * fVar16) - fVar2 * fVar20) - fVar1 * fVar22;
  m[3][2] = ((fVar12 - fVar3 * fVar26) - fVar2 * fVar25) - fVar1 * fVar23;
  m[3][3] = ((fVar9 - fVar3 * fVar19) - fVar2 * fVar14) - fVar1 * fVar13;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_at(mat4 m, vec3 pivot, float angle, vec3 axis) {
  glm_rotate_at(m, pivot, angle, axis);
}